

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc_base_func.cpp
# Opt level: O0

uint32_t ivk::cmd_if(void *el)

{
  bool bVar1;
  pointer ppVar2;
  iterator iStack_70;
  uint32_t ret;
  allocator local_51;
  string local_50 [32];
  _Self local_30;
  iterator it;
  XMLElement *pEl;
  XMLElement **ppEl;
  void *el_local;
  
  if (el == (void *)0x0) {
    el_local._4_4_ = 2;
  }
  else {
    it._M_node = *el;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,"ret",&local_51);
    local_30._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>_>
         ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>_>
                 *)gCmdMemMap_abi_cxx11_,(key_type *)local_50);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    iStack_70 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>_>
                ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>_>
                       *)gCmdMemMap_abi_cxx11_);
    bVar1 = std::operator==(&local_30,&stack0xffffffffffffff90);
    if (bVar1) {
      el_local._4_4_ = 7;
    }
    else {
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>
               ::operator->(&local_30);
      if (*(int *)(ppVar2->second).data != 0) {
        proc_exec(el);
      }
      el_local._4_4_ = 0;
    }
  }
  return el_local._4_4_;
}

Assistant:

uint32_t ivk::cmd_if(void* el){
    if(!el){
        return proc_param_err;
    }

    XMLElement** ppEl = (XMLElement**)el;
    XMLElement* pEl = *ppEl;

    // 读取返回值ret
    map<string,proc_data>::iterator it = gCmdMemMap.find("ret");
    if(it==gCmdMemMap.end()){
        return proc_mem_err;
    }

    // 如果ret非0,则继续执行这个
    uint32_t ret = *(uint32_t*)it->second.data;
    if(ret){
        proc_exec(el); // 执行while中所有指令,并可能对ret值做修改
    }
    return proc_success;
}